

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceMemcpyCase::deinit(ReferenceMemcpyCase *this)

{
  pointer puVar1;
  pointer puVar2;
  
  puVar1 = (this->m_dstBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_dstBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_dstBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dstBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dstBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::deinit
            (&this->
              super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            );
  return;
}

Assistant:

void ReferenceMemcpyCase::deinit (void)
{
	m_dstBuf = std::vector<deUint8>();
	BasicUploadCase<SingleOperationDuration>::deinit();
}